

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation.h
# Opt level: O3

bilingual_str * __thiscall
tinyformat::format<char[13],int,int,int,char[42]>
          (bilingual_str *__return_storage_ptr__,tinyformat *this,bilingual_str *fmt,
          char (*args) [13],int *args_1,int *args_2,int *args_3,char (*args_4) [42])

{
  long lVar1;
  long in_FS_OFFSET;
  char (*in_stack_ffffffffffffffc0) [42];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  format<char[13],int,int,int,char[42]>
            (&__return_storage_ptr__->original,this,&fmt->original,args,args_1,args_2,args_3,
             in_stack_ffffffffffffffc0);
  format<char[13],int,int,int,char[42]>
            (&__return_storage_ptr__->translated,this + 0x20,&fmt->original,args,args_1,args_2,
             args_3,in_stack_ffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

bilingual_str format(const bilingual_str& fmt, const Args&... args)
{
    const auto translate_arg{[](const auto& arg, bool translated) -> const auto& {
        if constexpr (std::is_same_v<decltype(arg), const bilingual_str&>) {
            return translated ? arg.translated : arg.original;
        } else {
            return arg;
        }
    }};
    return bilingual_str{tfm::format(fmt.original, translate_arg(args, false)...),
                         tfm::format(fmt.translated, translate_arg(args, true)...)};
}